

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarExpandedBitDecoder.cpp
# Opt level: O2

string * ZXing::OneD::DataBar::DecodeCompressedGTIN
                   (string *__return_storage_ptr__,string *prefix,BitArrayView *bits)

{
  uint uVar1;
  undefined8 in_RCX;
  int iVar2;
  bool bVar3;
  string local_50;
  
  iVar2 = 4;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    uVar1 = BitArrayView::readBits(bits,10);
    ToString<int,void>(&local_50,(ZXing *)(ulong)uVar1,3,(int)in_RCX);
    std::__cxx11::string::append((string *)prefix);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::substr((ulong)&local_50,(ulong)prefix);
  GTIN::ComputeCheckDigit<char>(&local_50,false);
  std::__cxx11::string::push_back((char)prefix);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)prefix);
  return __return_storage_ptr__;
}

Assistant:

static std::string DecodeCompressedGTIN(std::string prefix, BitArrayView& bits)
{
	for (int i = 0; i < 4; ++i)
		prefix.append(ToString(bits.readBits(10), 3));

	prefix.push_back(GTIN::ComputeCheckDigit(prefix.substr(2)));

	return prefix;
}